

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O0

void __thiscall
iu_StringStreamFileUnitTest_x_iutest_x_FileSize_Test::
~iu_StringStreamFileUnitTest_x_iutest_x_FileSize_Test
          (iu_StringStreamFileUnitTest_x_iutest_x_FileSize_Test *this)

{
  iu_StringStreamFileUnitTest_x_iutest_x_FileSize_Test *this_local;
  
  iutest::Test::~Test(&this->super_Test);
  return;
}

Assistant:

IUTEST(StringStreamFileUnitTest, FileSize)
{
    ::iutest::StringStreamFile file;
    ::iutest::internal::FilePath filename(__FILE__);
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenAppend) );
    IUTEST_EXPECT_EQ(0u, file.GetSize());
    const char data[] = "test";
    char buf[16];
    IUTEST_EXPECT_TRUE( file.Write(data, sizeof(data), 1) );
    IUTEST_EXPECT_TRUE( file.Read(buf, sizeof(data), 1) );
    IUTEST_EXPECT_EQ(sizeof(data), file.GetSize());
    IUTEST_EXPECT_STREQ(data, buf);
}